

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

CompilerFeaturesHandle __thiscall
cmQtAutoGenGlobalInitializer::GetCompilerFeatures
          (cmQtAutoGenGlobalInitializer *this,string *generator,string *executable,string *error)

{
  bool bVar1;
  pointer ppVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
  in_R8;
  CompilerFeaturesHandle CVar5;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  rep_conflict local_d8;
  undefined1 local_cd;
  int local_cc;
  undefined1 local_c8 [3];
  bool runResult;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string stdErr;
  string stdOut;
  string local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
  local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
  local_38;
  iterator it;
  string *error_local;
  string *executable_local;
  string *generator_local;
  cmQtAutoGenGlobalInitializer *this_local;
  CompilerFeaturesHandle *res;
  
  it.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
               )in_R8._M_cur;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
               *)((long)&generator[3].field_2 + 8),error);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
              *)((long)&generator[3].field_2 + 8));
  bVar1 = std::__detail::operator!=(&local_38,&local_40);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_false,_true>
                           *)&local_38);
    std::shared_ptr<cmQtAutoGen::CompilerFeatures>::shared_ptr
              ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)this,&ppVar2->second);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    bVar1 = cmsys::SystemTools::FileExists(error,true);
    if (bVar1) {
      std::__cxx11::string::string((string *)(stdErr.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)
                 &command.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_c8,error
                );
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_c8,
                 (char (*) [3])"-h");
      local_cc = 0;
      local_d8 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
      bVar1 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_c8,(string *)((long)&stdErr.field_2 + 8),
                         (string *)
                         &command.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_cc,(char *)0x0,
                         OUTPUT_NONE,(cmDuration)local_d8,Auto);
      local_cd = bVar1;
      if (!bVar1) {
        std::__cxx11::string::operator=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,"Test run of \"");
        std::__cxx11::string::operator+=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,(string *)executable);
        std::__cxx11::string::operator+=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,"\" executable ");
        cmQtAutoGen::Quoted(&local_118,error);
        std::operator+(&local_f8,&local_118," failed.\n");
        std::__cxx11::string::operator+=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        cmQtAutoGen::QuotedCommand
                  (&local_138,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c8);
        std::__cxx11::string::operator+=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,(string *)&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::__cxx11::string::operator+=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,"\n");
        std::__cxx11::string::operator+=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,(string *)(stdErr.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,"\n");
        std::__cxx11::string::operator+=
                  ((string *)
                   it.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                   ._M_cur,(string *)
                           &command.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::shared_ptr
                  ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)this);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8);
      std::__cxx11::string::~string
                ((string *)
                 &command.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
        peVar3 = std::
                 __shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::__cxx11::string::operator=
                  ((string *)&peVar3->HelpOutput,(string *)(stdErr.field_2._M_local_buf + 8));
        std::
        unordered_map<std::__cxx11::string,std::shared_ptr<cmQtAutoGen::CompilerFeatures>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>>
        ::emplace<std::__cxx11::string_const&,std::shared_ptr<cmQtAutoGen::CompilerFeatures>&>
                  ((unordered_map<std::__cxx11::string,std::shared_ptr<cmQtAutoGen::CompilerFeatures>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>>
                    *)(generator[3].field_2._M_local_buf + 8),error,
                   (shared_ptr<cmQtAutoGen::CompilerFeatures> *)this);
      }
      std::__cxx11::string::~string((string *)(stdErr.field_2._M_local_buf + 8));
      _Var4._M_pi = extraout_RDX_01;
    }
    else {
      std::__cxx11::string::operator=
                ((string *)
                 it.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                 ._M_cur,"The \"");
      std::__cxx11::string::operator+=
                ((string *)
                 it.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                 ._M_cur,(string *)executable);
      std::__cxx11::string::operator+=
                ((string *)
                 it.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                 ._M_cur,"\" executable ");
      cmQtAutoGen::Quoted(&local_60,error);
      std::__cxx11::string::operator+=
                ((string *)
                 it.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                 ._M_cur,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::operator+=
                ((string *)
                 it.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                 ._M_cur," does not exist.");
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::shared_ptr
                ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)this);
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  CVar5.super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  CVar5.super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CompilerFeaturesHandle)
         CVar5.super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmQtAutoGen::CompilerFeaturesHandle
cmQtAutoGenGlobalInitializer::GetCompilerFeatures(
  std::string const& generator, std::string const& executable,
  std::string& error)
{
  // Check if we have cached features
  {
    auto it = this->CompilerFeatures_.find(executable);
    if (it != this->CompilerFeatures_.end()) {
      return it->second;
    }
  }

  // Check if the executable exists
  if (!cmSystemTools::FileExists(executable, true)) {
    error = "The \"";
    error += generator;
    error += "\" executable ";
    error += cmQtAutoGen::Quoted(executable);
    error += " does not exist.";
    return cmQtAutoGen::CompilerFeaturesHandle();
  }

  // Test the executable
  std::string stdOut;
  {
    std::string stdErr;
    std::vector<std::string> command;
    command.emplace_back(executable);
    command.emplace_back("-h");
    int retVal = 0;
    const bool runResult = cmSystemTools::RunSingleCommand(
      command, &stdOut, &stdErr, &retVal, nullptr, cmSystemTools::OUTPUT_NONE,
      cmDuration::zero(), cmProcessOutput::Auto);
    if (!runResult) {
      error = "Test run of \"";
      error += generator;
      error += "\" executable ";
      error += cmQtAutoGen::Quoted(executable) + " failed.\n";
      error += cmQtAutoGen::QuotedCommand(command);
      error += "\n";
      error += stdOut;
      error += "\n";
      error += stdErr;
      return cmQtAutoGen::CompilerFeaturesHandle();
    }
  }

  // Create valid handle
  cmQtAutoGen::CompilerFeaturesHandle res =
    std::make_shared<cmQtAutoGen::CompilerFeatures>();
  res->HelpOutput = std::move(stdOut);

  // Register compiler features
  this->CompilerFeatures_.emplace(executable, res);

  return res;
}